

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_OpenDoor(FParser *this)

{
  int tag;
  int iVar1;
  int iVar2;
  EVlDoor type;
  int delay;
  bool bVar3;
  double speed;
  
  if (this->t_argc < 1) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  tag = intvalue(this->t_argv);
  if (tag != 0) {
    if (this->t_argc < 2) {
      speed = 2.0;
      type = doorOpen;
      delay = 0;
    }
    else {
      iVar1 = intvalue(this->t_argv + 1);
      delay = (iVar1 * 0x23) / 100;
      iVar2 = 1;
      if (2 < this->t_argc) {
        iVar2 = intvalue(this->t_argv + 2);
      }
      bVar3 = iVar1 * 0x23 + 99U < 199;
      if (bVar3) {
        delay = 0;
      }
      type = doorRaise - bVar3;
      iVar1 = 0x7f;
      if (iVar2 < 0x7f) {
        iVar1 = iVar2;
      }
      iVar2 = 1;
      if (1 < iVar1) {
        iVar2 = iVar1;
      }
      speed = (double)(iVar2 * 2);
    }
    EV_DoDoor(type,(line_t_conflict *)0x0,(AActor *)0x0,tag,speed,delay,0,0,false,0);
  }
  return;
}

Assistant:

void FParser::SF_OpenDoor(void)
{
	int speed, wait_time;
	int sectag;
	
	if (CheckArgs(1))
	{
		// got sector tag
		sectag = intvalue(t_argv[0]);
		if (sectag==0) return;	// tag 0 not allowed
		
		// door wait time
		if(t_argc > 1) wait_time = (intvalue(t_argv[1]) * TICRATE) / 100;
		else wait_time = 0;  // 0= stay open
		
		// door speed
		if(t_argc > 2) speed = intvalue(t_argv[2]);
		else speed = 1;    // 1= normal speed

		EV_DoDoor(wait_time ? DDoor::doorRaise : DDoor::doorOpen, NULL, NULL, sectag, 2. * clamp(speed, 1, 127), wait_time, 0, 0);
	}
}